

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipboard.c
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  char *pcVar1;
  char *__format;
  
  if (action == 1) {
    if (key == 0x43) {
      if (mods == 2) {
        glfwSetClipboardString(window,"Hello GLFW World!");
        __format = "Setting clipboard to \"%s\"\n";
        pcVar1 = "Hello GLFW World!";
LAB_00106d01:
        printf(__format,pcVar1);
        return;
      }
    }
    else if (key == 0x56) {
      if (mods == 2) {
        pcVar1 = glfwGetClipboardString(window);
        if (pcVar1 == (char *)0x0) {
          puts("Clipboard does not contain a string");
          return;
        }
        __format = "Clipboard contains \"%s\"\n";
        goto LAB_00106d01;
      }
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
      return;
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GL_TRUE);
            break;

        case GLFW_KEY_V:
            if (mods == GLFW_MOD_CONTROL)
            {
                const char* string;

                string = glfwGetClipboardString(window);
                if (string)
                    printf("Clipboard contains \"%s\"\n", string);
                else
                    printf("Clipboard does not contain a string\n");
            }
            break;

        case GLFW_KEY_C:
            if (mods == GLFW_MOD_CONTROL)
            {
                const char* string = "Hello GLFW World!";
                glfwSetClipboardString(window, string);
                printf("Setting clipboard to \"%s\"\n", string);
            }
            break;
    }
}